

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stair_shuffle.c
# Opt level: O0

void mark_chests(dw_rom *rom,uint8_t flag)

{
  dw_chest *pdVar1;
  dungeon_map *pdVar2;
  dungeon_map *map;
  dw_chest *chest;
  size_t y;
  size_t x;
  size_t i;
  uint8_t flag_local;
  dw_rom *rom_local;
  
  for (x = 0; x < 0x1f; x = x + 1) {
    pdVar1 = rom->chests + x;
    pdVar2 = get_map((uint)pdVar1->map);
    if ((((pdVar2 != (dungeon_map *)0x0) && (pdVar2->tiles[pdVar1->x][pdVar1->y] == '\f')) &&
        (rom->chest_access[x] = rom->chest_access[x] | flag, (flag & 0xf) != 0)) &&
       (pdVar1->item == '\x03')) {
      (rom->map).key_access = (rom->map).key_access | flag;
    }
  }
  return;
}

Assistant:

static void mark_chests(dw_rom *rom, uint8_t flag)
{
    size_t i, x, y;
    dw_chest *chest;
    dungeon_map *map;

    for (i = 0; i < CHEST_COUNT; i++) {
        chest = &rom->chests[i];
        map = get_map(chest->map);
        if (!map)
            continue;
        x = chest->x;
        y = chest->y;
        if (map->tiles[x][y] == (DUNGEON_TILE_CHEST | 8)) {
            rom->chest_access[i] |= flag;
            if (flag & 0xf && chest->item == KEY)
                rom->map.key_access |= flag;
        }
    }
}